

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O3

void btSoftBodyHelpers::Draw(btSoftBody *psb,btIDebugDraw *idraw,int drawflags)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Edge *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  Node *pNVar8;
  Link *pLVar9;
  RContact *pRVar10;
  Face *pFVar11;
  long lVar12;
  long lVar13;
  Tetra *pTVar14;
  long lVar15;
  Anchor *pAVar16;
  Note *pNVar17;
  Joint *pJVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  btIDebugDraw *pbVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  btVector3 *pbVar25;
  btTransform *pbVar26;
  undefined1 auVar27 [8];
  uint uVar28;
  long lVar29;
  float *pfVar30;
  long lVar31;
  Edge *pEVar32;
  long lVar33;
  float fVar34;
  float fVar35;
  float fVar37;
  btScalar abVar36 [4];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  btAlignedObjectArray<btVector3> vertices;
  btVector3 o;
  btVector3 local_1f8;
  btAlignedObjectArray<btVector3> local_1e8;
  btIDebugDraw *local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  btScalar local_198 [4];
  btConvexHullComputer local_188;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  btScalar local_108 [4];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [12];
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [12];
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_88 = 1.0;
  fStack_84 = 1.0;
  fStack_80 = 1.0;
  uStack_7c = 0;
  local_78 = 0x3f800000;
  uStack_70 = 0;
  local_128._0_4_ = drawflags;
  local_1c0 = idraw;
  if (((uint)drawflags >> 8 & 1) == 0) {
    if (((drawflags & 1U) != 0) && (iVar24 = (psb->m_nodes).m_size, 0 < iVar24)) {
      lVar29 = 0x18;
      lVar33 = 0;
      do {
        pNVar8 = (psb->m_nodes).m_data;
        if ((*(byte *)(*(long *)((long)(&pNVar8->m_x + -2) + lVar29) + 0x14) & 1) != 0) {
          local_188.vertices.m_size = *(undefined4 *)((long)(&pNVar8->m_x + -2) + 0xc + lVar29);
          local_188.vertices._0_4_ = *(float *)((long)(&pNVar8->m_x + -2) + 8 + lVar29) + -0.1;
          local_188.vertices.m_capacity =
               *(undefined4 *)
                ((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.m_tag + lVar29)
          ;
          local_188.vertices._12_4_ = 0.0;
          uVar5 = *(undefined8 *)((long)(&pNVar8->m_x + -2) + 8 + lVar29);
          local_1e8.m_size = (int)((float)((ulong)uVar5 >> 0x20) + 0.0);
          local_1e8._0_4_ = (float)uVar5 + 0.1;
          local_1e8.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + 0.0);
          local_1e8._12_4_ = 0.0;
          local_1f8.m_floats = (btScalar  [4])ZEXT816(0x3f800000);
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_188,&local_1e8);
          local_188.vertices.m_size =
               (int)(*(float *)((long)(&pNVar8->m_x + -2) + 0xc + lVar29) + -0.1);
          local_188.vertices._0_4_ = *(undefined4 *)((long)(&pNVar8->m_x + -2) + 8 + lVar29);
          local_188.vertices.m_capacity =
               *(undefined4 *)
                ((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.m_tag + lVar29)
          ;
          local_188.vertices._12_4_ = 0.0;
          uVar5 = *(undefined8 *)((long)(&pNVar8->m_x + -2) + 8 + lVar29);
          local_1e8.m_size = (int)((float)((ulong)uVar5 >> 0x20) + 0.1);
          local_1e8._0_4_ = (float)uVar5 + 0.0;
          local_1e8.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + 0.0);
          local_1e8._12_4_ = 0.0;
          local_1f8.m_floats = (btScalar  [4])ZEXT816(0x3f80000000000000);
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_188,&local_1e8,&local_1f8);
          local_188.vertices.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + -0.1);
          local_188.vertices._0_8_ = *(undefined8 *)((long)(&pNVar8->m_x + -2) + 8 + lVar29);
          local_188.vertices._12_4_ = 0.0;
          uVar5 = *(undefined8 *)((long)(&pNVar8->m_x + -2) + 8 + lVar29);
          local_1e8.m_size = (int)((float)((ulong)uVar5 >> 0x20) + 0.0);
          local_1e8._0_4_ = (float)uVar5 + 0.0;
          local_1e8.m_capacity =
               (int)(*(float *)((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar29) + 0.1);
          local_1e8._12_4_ = 0.0;
          local_1f8.m_floats._0_12_ = ZEXT412(0x3f800000) << 0x40;
          local_1f8.m_floats[3] = 0.0;
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_188,&local_1e8,&local_1f8);
          iVar24 = (psb->m_nodes).m_size;
        }
        lVar33 = lVar33 + 1;
        lVar29 = lVar29 + 0x78;
      } while (lVar33 < iVar24);
    }
    auVar20 = local_128;
    uVar28 = local_128._0_4_;
    if (((local_128 & (undefined1  [16])0x2) != (undefined1  [16])0x0) &&
       (iVar24 = (psb->m_links).m_size, 0 < iVar24)) {
      lVar33 = 0x18;
      lVar29 = 0;
      do {
        pLVar9 = (psb->m_links).m_data;
        if ((*(byte *)(*(long *)((long)pLVar9->m_n + lVar33 + -0x20) + 0x14) & 1) != 0) {
          (*local_1c0->_vptr_btIDebugDraw[4])
                    (local_1c0,*(long *)((long)pLVar9->m_n + lVar33 + -0x18) + 0x10,
                     *(long *)((long)pLVar9->m_n + lVar33 + -0x10) + 0x10,&local_48);
          iVar24 = (psb->m_links).m_size;
        }
        lVar29 = lVar29 + 1;
        lVar33 = lVar33 + 0x48;
      } while (lVar29 < iVar24);
    }
    pbVar21 = local_1c0;
    if (((auVar20 & (undefined1  [16])0x10) != (undefined1  [16])0x0) &&
       (iVar24 = (psb->m_nodes).m_size, 0 < iVar24)) {
      lVar29 = 0x58;
      lVar33 = 0;
      do {
        pNVar8 = (psb->m_nodes).m_data;
        if ((*(byte *)(*(long *)((long)(&pNVar8->m_x + -6) + lVar29) + 0x14) & 1) != 0) {
          pfVar1 = (float *)((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.
                                    m_tag + lVar29);
          pfVar30 = pfVar1 + -0x12;
          local_1b8._0_4_ = *pfVar1 * 0.5;
          local_198[0] = (float)*(undefined8 *)(pfVar1 + -2) * 0.5;
          local_198[1] = (float)((ulong)*(undefined8 *)(pfVar1 + -2) >> 0x20) * 0.5;
          local_198[2] = 0.0;
          local_198[3] = 0.0;
          local_188.vertices.m_size =
               (int)((float)((ulong)*(undefined8 *)pfVar30 >> 0x20) + local_198[1]);
          local_188.vertices._0_4_ = (float)*(undefined8 *)pfVar30 + local_198[0];
          local_188.vertices.m_capacity = (int)(pfVar1[-0x10] + *pfVar1 * 0.5);
          local_188.vertices._12_4_ = 0.0;
          (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,pfVar30,&local_188,&local_88);
          local_188.vertices.m_size =
               (int)((float)((ulong)*(undefined8 *)pfVar30 >> 0x20) - local_198[1]);
          local_188.vertices._0_4_ = (float)*(undefined8 *)pfVar30 - local_198[0];
          local_188.vertices.m_capacity = (int)(pfVar1[-0x10] - (float)local_1b8._0_4_);
          local_188.vertices._12_4_ = 0.0;
          local_1e8.m_size = (int)(fStack_84 * 0.5);
          local_1e8._0_4_ = local_88 * 0.5;
          local_1e8.m_capacity = (int)(fStack_80 * 0.5);
          local_1e8._12_4_ = 0.0;
          uVar28 = local_128._0_4_;
          (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,pfVar30,&local_188,&local_1e8);
          iVar24 = (psb->m_nodes).m_size;
        }
        lVar33 = lVar33 + 1;
        lVar29 = lVar29 + 0x78;
      } while (lVar33 < iVar24);
    }
    if ((uVar28 & 0x20) != 0) {
      if (Draw(btSoftBody*,btIDebugDraw*,int)::axis == '\0') {
        Draw();
      }
      pbVar21 = local_1c0;
      if (0 < (psb->m_rcontacts).m_size) {
        lVar29 = 8;
        lVar33 = 0;
        do {
          pRVar10 = (psb->m_rcontacts).m_data;
          lVar31 = *(long *)((long)(&(pRVar10->m_cti).m_normal + 1) + lVar29);
          fVar34 = *(float *)(lVar31 + 0x18);
          fVar40 = *(float *)((long)(pRVar10->m_cti).m_normal.m_floats + lVar29);
          uVar5 = *(undefined8 *)(lVar31 + 0x10);
          uVar6 = *(undefined8 *)((long)(pRVar10->m_cti).m_normal.m_floats + lVar29 + -8);
          fVar39 = (float)uVar6;
          fVar41 = (float)((ulong)uVar6 >> 0x20);
          fVar35 = (float)uVar5;
          fVar37 = (float)((ulong)uVar5 >> 0x20);
          fVar38 = fVar34 * fVar40 + fVar35 * fVar39 + fVar37 * fVar41 +
                   *(float *)((long)(pRVar10->m_cti).m_normal.m_floats + lVar29 + 8);
          fVar35 = fVar35 - fVar38 * fVar39;
          fVar37 = fVar37 - fVar38 * fVar41;
          local_188.vertices.m_size = (int)fVar37;
          local_188.vertices._0_4_ = fVar35;
          fVar34 = fVar34 - fVar38 * fVar40;
          local_188.vertices.m_capacity = (int)fVar34;
          local_188.vertices._12_4_ = 0.0;
          local_1b8._4_4_ = *(float *)((long)(pRVar10->m_cti).m_normal.m_floats + lVar29 + -8);
          uVar7 = *(ulong *)((long)(pRVar10->m_cti).m_normal.m_floats + lVar29 + -4);
          fVar39 = (float)uVar7;
          local_1b8._0_4_ = (undefined4)(uVar7 >> 0x20);
          fVar40 = (float)local_1b8._4_4_;
          if (fVar39 <= (float)local_1b8._4_4_) {
            fVar40 = fVar39;
          }
          uVar28 = (uint)(fVar39 <= (float)local_1b8._4_4_);
          if ((float)local_1b8._0_4_ <= fVar40) {
            uVar28 = 2;
          }
          uVar5 = *(undefined8 *)((long)Draw::axis[0].m_floats + (ulong)(uVar28 << 4) + 4);
          fVar41 = (float)uVar5;
          local_b8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
          fVar40 = *(float *)((long)Draw::axis[0].m_floats + (ulong)(uVar28 << 4));
          uStack_1b0._0_4_ = local_1b8._0_4_;
          uStack_1b0._4_4_ = local_1b8._0_4_;
          local_118._0_4_ = (float)local_b8._4_4_ * fVar39 - fVar41 * (float)local_1b8._0_4_;
          local_118._4_4_ =
               fVar40 * (float)local_1b8._0_4_ - (float)local_b8._4_4_ * (float)local_1b8._4_4_;
          local_108[2] = 0.0;
          local_108[3] = 0.0;
          local_108[0] = (btScalar)(int)uVar7;
          local_108[1] = (btScalar)(int)(uVar7 >> 0x20);
          fVar41 = fVar41 * (float)local_1b8._4_4_ - fVar40 * fVar39;
          fVar40 = 1.0 / SQRT(fVar41 * fVar41 +
                              (float)local_118._0_4_ * (float)local_118._0_4_ +
                              (float)local_118._4_4_ * (float)local_118._4_4_);
          local_b8._0_4_ = fVar41 * fVar40;
          local_b8._8_8_ = 0;
          local_118._0_4_ = fVar40 * (float)local_118._0_4_;
          local_118._4_4_ = fVar40 * (float)local_118._4_4_;
          local_118._8_4_ = fVar40 * ((float)local_b8._4_4_ * 0.0 - (float)local_1b8._0_4_ * 0.0);
          local_118._12_4_ = fVar40 * ((float)local_b8._4_4_ * 0.0 - (float)local_1b8._0_4_ * 0.0);
          local_198[1] = (btScalar)local_118._4_4_;
          local_198[0] = (float)local_118._0_4_ * fVar39 -
                         (float)local_118._4_4_ * (float)local_1b8._4_4_;
          local_198[2] = (btScalar)local_118._8_4_;
          local_198[3] = (btScalar)local_118._12_4_;
          fVar40 = fVar41 * fVar40 * 0.5;
          local_1e8.m_size = (int)(fVar37 - (float)local_118._4_4_ * 0.5);
          local_1e8._0_4_ = fVar35 - (float)local_118._0_4_ * 0.5;
          local_1e8.m_capacity = (int)(fVar34 - fVar40);
          local_1e8._12_4_ = 0.0;
          local_1f8.m_floats[0] = (float)local_118._0_4_ * 0.5 + fVar35;
          local_1f8.m_floats[1] = (float)local_118._4_4_ * 0.5 + fVar37;
          local_1f8.m_floats[2] = fVar40 + fVar34;
          local_1f8.m_floats[3] = 0.0;
          (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,&local_1e8,&local_1f8,&local_78);
          fVar40 = (float)local_118._4_4_ * (float)local_1b8._0_4_ -
                   (float)local_b8._0_4_ * local_108[0];
          fVar35 = (float)local_b8._0_4_ * (float)local_1b8._4_4_ -
                   (float)local_118._0_4_ * local_108[1];
          fVar34 = 1.0 / SQRT(local_198[0] * local_198[0] + fVar40 * fVar40 + fVar35 * fVar35);
          fVar40 = fVar34 * fVar40 * 0.5;
          fVar35 = fVar34 * fVar35 * 0.5;
          fVar34 = local_198[0] * fVar34 * 0.5;
          local_1e8._0_4_ = local_188.vertices._0_4_ - fVar40;
          local_1e8.m_size = (int)(local_188.vertices.m_size - fVar35);
          local_1e8.m_capacity = (int)((float)local_188.vertices.m_capacity - fVar34);
          local_1e8._12_4_ = 0.0;
          local_1f8.m_floats[0] = fVar40 + local_188.vertices._0_4_;
          local_1f8.m_floats[1] = fVar35 + local_188.vertices.m_size;
          local_1f8.m_floats[2] = fVar34 + (float)local_188.vertices.m_capacity;
          local_1f8.m_floats[3] = 0.0;
          (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,&local_1e8,&local_1f8,&local_78);
          uVar5 = *(undefined8 *)((long)(pRVar10->m_cti).m_normal.m_floats + lVar29 + -8);
          local_1e8._0_4_ = local_188.vertices._0_4_ + (float)uVar5 * 0.5 * 3.0;
          local_1e8.m_size =
               (int)(local_188.vertices.m_size + (float)((ulong)uVar5 >> 0x20) * 0.5 * 3.0);
          local_1e8.m_capacity =
               (int)(*(float *)((long)(pRVar10->m_cti).m_normal.m_floats + lVar29) * 0.5 * 3.0 +
                    (float)local_188.vertices.m_capacity);
          local_1e8._12_4_ = 0.0;
          local_1f8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
          (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,&local_188,&local_1e8,&local_1f8);
          lVar33 = lVar33 + 1;
          lVar29 = lVar29 + 0x78;
        } while (lVar33 < (psb->m_rcontacts).m_size);
      }
    }
    if ((local_128 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
      local_188.vertices._0_16_ = ZEXT816(0x3f33333300000000);
      iVar24 = (psb->m_faces).m_size;
      if (0 < iVar24) {
        lVar33 = 0x20;
        lVar29 = 0;
        do {
          pFVar11 = (psb->m_faces).m_data;
          if ((*(byte *)(*(long *)((long)pFVar11->m_n + lVar33 + -0x28) + 0x14) & 1) != 0) {
            lVar31 = *(long *)((long)pFVar11->m_n + lVar33 + -0x20);
            lVar12 = *(long *)((long)pFVar11->m_n + lVar33 + -0x18);
            fVar34 = *(float *)(lVar12 + 0x18);
            lVar13 = *(long *)((long)pFVar11->m_n + lVar33 + -0x10);
            fVar40 = *(float *)(lVar13 + 0x18);
            fVar37 = (*(float *)(lVar31 + 0x18) + fVar34 + fVar40) * 0.33333334;
            uVar5 = *(undefined8 *)(lVar12 + 0x10);
            fVar39 = (float)uVar5;
            fVar41 = (float)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)(lVar13 + 0x10);
            fVar38 = (float)uVar5;
            fVar43 = (float)((ulong)uVar5 >> 0x20);
            fVar42 = (*(float *)(lVar31 + 0x10) + fVar39 + fVar38) * 0.33333334;
            fVar35 = (fVar43 + fVar41 + *(float *)(lVar31 + 0x14)) * 0.33333334;
            local_1e8.m_size = (int)((*(float *)(lVar31 + 0x14) - fVar35) * 0.8 + fVar35);
            local_1e8._0_4_ = fVar42 + (*(float *)(lVar31 + 0x10) - fVar42) * 0.8;
            local_1e8.m_capacity = (int)((*(float *)(lVar31 + 0x18) - fVar37) * 0.8 + fVar37);
            local_1e8._12_4_ = 0;
            local_1f8.m_floats[1] = (fVar41 - fVar35) * 0.8 + fVar35;
            local_1f8.m_floats[0] = (fVar39 - fVar42) * 0.8 + fVar42;
            local_1f8.m_floats[2] = (fVar34 - fVar37) * 0.8 + fVar37;
            local_1f8.m_floats[3] = 0.0;
            local_1a8._4_4_ = (fVar43 - fVar35) * 0.8 + fVar35;
            local_1a8._0_4_ = (fVar38 - fVar42) * 0.8 + fVar42;
            local_1a8._8_4_ = (fVar40 - fVar37) * 0.8 + fVar37;
            local_1a8._12_4_ = 0;
            (*local_1c0->_vptr_btIDebugDraw[9])
                      (0x3f800000,local_1c0,&local_1e8,&local_1f8,local_1a8,&local_188);
            iVar24 = (psb->m_faces).m_size;
          }
          lVar29 = lVar29 + 1;
          lVar33 = lVar33 + 0x48;
        } while (lVar29 < iVar24);
      }
    }
    pbVar21 = local_1c0;
    if ((local_128._0_4_ & 8) != 0) {
      local_188.vertices.m_capacity = 0x3f333333;
      local_188.vertices._0_8_ = 0x3e99999a3e99999a;
      local_188.vertices._12_4_ = 0;
      iVar24 = (psb->m_tetras).m_size;
      if (0 < iVar24) {
        lVar33 = 0x28;
        lVar29 = 0;
        do {
          pTVar14 = (psb->m_tetras).m_data;
          if ((*(byte *)(*(long *)((long)pTVar14->m_n + lVar33 + -0x30) + 0x14) & 1) != 0) {
            lVar31 = *(long *)((long)pTVar14->m_n + lVar33 + -0x28);
            lVar12 = *(long *)((long)pTVar14->m_n + lVar33 + -0x20);
            lVar13 = *(long *)((long)pTVar14->m_n + lVar33 + -0x18);
            lVar15 = *(long *)((long)pTVar14->m_n + lVar33 + -0x10);
            _local_1b8 = ZEXT416((uint)*(float *)(lVar15 + 0x10));
            _local_c8 = ZEXT416((uint)*(float *)(lVar15 + 0x14));
            local_b8 = ZEXT416((uint)*(float *)(lVar15 + 0x18));
            fVar43 = (*(float *)(lVar31 + 0x10) + *(float *)(lVar12 + 0x10) +
                      *(float *)(lVar13 + 0x10) + *(float *)(lVar15 + 0x10)) * 0.25;
            fVar40 = (*(float *)(lVar31 + 0x14) + *(float *)(lVar12 + 0x14) +
                      *(float *)(lVar13 + 0x14) + *(float *)(lVar15 + 0x14)) * 0.25;
            fVar34 = (*(float *)(lVar31 + 0x18) + *(float *)(lVar12 + 0x18) +
                      *(float *)(lVar13 + 0x18) + *(float *)(lVar15 + 0x18)) * 0.25;
            fVar38 = (*(float *)(lVar31 + 0x10) - fVar43) * 0.8 + fVar43;
            fVar41 = (*(float *)(lVar31 + 0x14) - fVar40) * 0.8 + fVar40;
            fVar39 = (*(float *)(lVar31 + 0x18) - fVar34) * 0.8 + fVar34;
            local_198[1] = fVar41;
            local_198[0] = fVar38;
            local_198[2] = fVar39;
            local_198[3] = 0.0;
            fVar42 = (*(float *)(lVar12 + 0x10) - fVar43) * 0.8 + fVar43;
            fVar37 = (*(float *)(lVar12 + 0x14) - fVar40) * 0.8 + fVar40;
            fVar35 = (*(float *)(lVar12 + 0x18) - fVar34) * 0.8 + fVar34;
            local_118._4_4_ = fVar37;
            local_118._0_4_ = fVar42;
            local_118._8_4_ = fVar35;
            local_118._12_4_ = 0;
            local_d8 = CONCAT44(local_d8._4_4_,fVar43);
            local_e8 = CONCAT44(local_e8._4_4_,fVar40);
            local_f8._0_4_ = fVar34;
            fVar43 = (*(float *)(lVar13 + 0x10) - fVar43) * 0.8 + fVar43;
            fVar40 = (*(float *)(lVar13 + 0x14) - fVar40) * 0.8 + fVar40;
            fVar34 = (*(float *)(lVar13 + 0x18) - fVar34) * 0.8 + fVar34;
            local_108[1] = fVar40;
            local_108[0] = fVar43;
            local_108[2] = fVar34;
            local_108[3] = 0.0;
            local_1e8.m_size = (int)fVar41;
            local_1e8._0_4_ = fVar38;
            local_1e8.m_capacity = (int)fVar39;
            local_1e8._12_4_ = 0.0;
            local_1f8.m_floats[1] = fVar37;
            local_1f8.m_floats[0] = fVar42;
            local_1f8.m_floats[2] = fVar35;
            local_1f8.m_floats[3] = 0.0;
            local_1a8._4_4_ = fVar40;
            local_1a8._0_4_ = fVar43;
            local_1a8._8_4_ = fVar34;
            local_1a8._12_4_ = 0;
            (*pbVar21->_vptr_btIDebugDraw[9])
                      (0x3f800000,pbVar21,&local_1e8,&local_1f8,local_1a8,&local_188);
            auVar20 = local_118;
            abVar36 = local_198;
            local_1e8._0_4_ = local_198[0];
            local_1e8.m_size = (int)local_198[1];
            local_1e8.m_capacity = (int)local_198[2];
            local_1e8._12_4_ = local_198[3];
            local_1f8.m_floats[0] = (btScalar)local_118._0_4_;
            local_1f8.m_floats[1] = (btScalar)local_118._4_4_;
            local_1f8.m_floats[2] = (btScalar)local_118._8_4_;
            local_1f8.m_floats[3] = (btScalar)local_118._12_4_;
            local_1b8._0_4_ = ((float)local_1b8._0_4_ - (float)local_d8) * 0.8 + (float)local_d8;
            local_1b8._4_4_ = ((float)local_c8._0_4_ - (float)local_e8) * 0.8 + (float)local_e8;
            uStack_1b0._0_4_ =
                 ((float)local_b8._0_4_ - (float)local_f8._0_4_) * 0.8 + (float)local_f8._0_4_;
            uStack_1b0._4_4_ = 0;
            local_1a8 = _local_1b8;
            local_198 = abVar36;
            local_118 = auVar20;
            (*pbVar21->_vptr_btIDebugDraw[9])
                      (0x3f800000,pbVar21,&local_1e8,&local_1f8,local_1a8,&local_188);
            abVar36 = local_108;
            local_1e8._0_8_ = local_118._0_8_;
            local_1e8._8_8_ = local_118._8_8_;
            local_1f8.m_floats[0] = local_108[0];
            local_1f8.m_floats[1] = local_108[1];
            local_1f8.m_floats[2] = local_108[2];
            local_1f8.m_floats[3] = local_108[3];
            local_1a8._0_8_ = local_1b8;
            local_1a8._8_8_ = uStack_1b0;
            local_108 = abVar36;
            (*pbVar21->_vptr_btIDebugDraw[9])
                      (0x3f800000,pbVar21,&local_1e8,&local_1f8,local_1a8,&local_188);
            local_1e8._0_4_ = local_108[0];
            local_1e8.m_size = (int)local_108[1];
            local_1e8.m_capacity = (int)local_108[2];
            local_1e8._12_4_ = local_108[3];
            local_1f8.m_floats[0] = local_198[0];
            local_1f8.m_floats[1] = local_198[1];
            local_1f8.m_floats[2] = local_198[2];
            local_1f8.m_floats[3] = local_198[3];
            local_1a8 = _local_1b8;
            (*pbVar21->_vptr_btIDebugDraw[9])
                      (0x3f800000,pbVar21,&local_1e8,&local_1f8,local_1a8,&local_188);
            iVar24 = (psb->m_tetras).m_size;
          }
          lVar29 = lVar29 + 1;
          lVar33 = lVar33 + 0x88;
        } while (lVar29 < iVar24);
      }
    }
  }
  else {
    srand(0x70e);
    iVar24 = (psb->m_clusters).m_size;
    if (0 < iVar24) {
      auVar27 = (undefined1  [8])0x0;
      do {
        if ((psb->m_clusters).m_data[(long)auVar27]->m_collide == true) {
          local_1b8 = auVar27;
          iVar24 = rand();
          iVar22 = rand();
          iVar23 = rand();
          fVar34 = (float)iVar23 * 4.656613e-10;
          fVar40 = (float)iVar24 * 4.656613e-10;
          fVar35 = (float)iVar22 * 4.656613e-10;
          fVar37 = 1.0 / SQRT(fVar34 * fVar34 + fVar40 * fVar40 + fVar35 * fVar35);
          local_1f8.m_floats[1] = fVar37 * fVar35 * 0.75;
          local_1f8.m_floats[0] = fVar37 * fVar40 * 0.75;
          local_1f8.m_floats[2] = fVar34 * fVar37 * 0.75;
          local_1f8.m_floats[3] = 0.0;
          local_1e8.m_ownsMemory = true;
          local_1e8.m_data = (btVector3 *)0x0;
          local_1e8._4_8_ = 0;
          iVar24 = ((psb->m_clusters).m_data[(long)local_1b8]->m_nodes).m_size;
          lVar29 = (long)iVar24;
          if (lVar29 < 1) {
            local_1e8.m_size = iVar24;
          }
          else {
            pbVar25 = (btVector3 *)btAlignedAllocInternal(lVar29 << 4,0x10);
            if (0 < (long)local_1e8.m_size) {
              lVar33 = 0;
              do {
                puVar2 = (undefined8 *)((long)(local_1e8.m_data)->m_floats + lVar33);
                uVar5 = puVar2[1];
                puVar3 = (undefined8 *)((long)pbVar25->m_floats + lVar33);
                *puVar3 = *puVar2;
                puVar3[1] = uVar5;
                lVar33 = lVar33 + 0x10;
              } while ((long)local_1e8.m_size * 0x10 != lVar33);
            }
            if ((local_1e8.m_data != (btVector3 *)0x0) && (local_1e8.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_1e8.m_data);
            }
            auVar20 = (undefined1  [16])local_1e8._0_16_;
            local_1e8.m_capacity = iVar24;
            local_1e8._0_4_ = auVar20._0_4_;
            local_1e8.m_size = iVar24;
            local_1e8.m_data = pbVar25;
            if (0 < iVar24) {
              lVar33 = 0;
              do {
                lVar31 = *(long *)((long)((psb->m_clusters).m_data[(long)local_1b8]->m_nodes).m_data
                                  + lVar33);
                uVar5 = *(undefined8 *)(lVar31 + 0x18);
                puVar2 = (undefined8 *)((long)pbVar25->m_floats + lVar33 * 2);
                *puVar2 = *(undefined8 *)(lVar31 + 0x10);
                puVar2[1] = uVar5;
                lVar33 = lVar33 + 8;
              } while (lVar29 * 8 != lVar33);
            }
          }
          local_1e8.m_ownsMemory = true;
          local_188.vertices.m_ownsMemory = true;
          local_188.vertices.m_data = (btVector3 *)0x0;
          local_188.vertices._4_8_ = 0;
          local_188.edges.m_ownsMemory = true;
          local_188.edges.m_data = (Edge *)0x0;
          local_188.edges.m_size = 0;
          local_188.edges.m_capacity = 0;
          local_188.faces.m_ownsMemory = true;
          local_188.faces.m_data = (int *)0x0;
          local_188.faces.m_size = 0;
          local_188.faces.m_capacity = 0;
          btConvexHullComputer::compute(&local_188,local_1e8.m_data,false,0x10,iVar24,0.0,0.0);
          if (0 < local_188.faces.m_size) {
            lVar29 = 0;
            iVar24 = local_188.faces.m_size;
            do {
              pEVar4 = local_188.edges.m_data + local_188.faces.m_data[lVar29];
              pEVar32 = pEVar4 + pEVar4->reverse + pEVar4[pEVar4->reverse].next;
              if (pEVar32 != pEVar4) {
                iVar24 = pEVar4[pEVar4->reverse].targetVertex;
                iVar22 = pEVar4->targetVertex;
                do {
                  iVar23 = pEVar32->targetVertex;
                  (*local_1c0->_vptr_btIDebugDraw[9])
                            (0x3f800000,local_1c0,local_188.vertices.m_data + iVar24,
                             local_188.vertices.m_data + iVar22,local_188.vertices.m_data + iVar23,
                             &local_1f8);
                  pEVar32 = pEVar32 + pEVar32->reverse + pEVar32[pEVar32->reverse].next;
                  iVar24 = iVar22;
                  iVar22 = iVar23;
                } while (pEVar32 != pEVar4);
                iVar24 = local_188.faces.m_size;
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 < iVar24);
          }
          btAlignedObjectArray<int>::~btAlignedObjectArray
                    ((btAlignedObjectArray<int> *)((long)&local_188 + 0x40));
          btAlignedObjectArray<btConvexHullComputer::Edge>::~btAlignedObjectArray
                    ((btAlignedObjectArray<btConvexHullComputer::Edge> *)((long)&local_188 + 0x20));
          btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_188.vertices);
          btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_1e8);
          iVar24 = (psb->m_clusters).m_size;
          auVar27 = local_1b8;
        }
        auVar27 = (undefined1  [8])((long)auVar27 + 1);
      } while ((long)auVar27 < (long)iVar24);
    }
  }
  pbVar21 = local_1c0;
  uVar28 = local_128._0_4_;
  if ((local_128 & (undefined1  [16])0x40) != (undefined1  [16])0x0) {
    if (0 < (psb->m_anchors).m_size) {
      lVar33 = 0;
      lVar29 = 0;
      do {
        pAVar16 = (psb->m_anchors).m_data;
        lVar31 = *(long *)((long)(pAVar16->m_c0).m_el[0].m_floats + lVar33 + -0xc);
        fVar34 = *(float *)((long)(pAVar16->m_local).m_floats + lVar33);
        fVar40 = *(float *)((long)(pAVar16->m_local).m_floats + lVar33 + 4);
        fVar35 = *(float *)((long)(pAVar16->m_local).m_floats + lVar33 + 8);
        local_188.vertices.m_size =
             (int)((float)((ulong)*(undefined8 *)(lVar31 + 0x38) >> 0x20) +
                  *(float *)(lVar31 + 0x20) * fVar35 +
                  fVar34 * *(float *)(lVar31 + 0x18) + *(float *)(lVar31 + 0x1c) * fVar40);
        local_188.vertices._0_4_ =
             (float)*(undefined8 *)(lVar31 + 0x38) +
             *(float *)(lVar31 + 0x10) * fVar35 +
             fVar34 * *(float *)(lVar31 + 8) + *(float *)(lVar31 + 0xc) * fVar40;
        local_188.vertices.m_capacity =
             (int)(*(float *)(lVar31 + 0x30) * fVar35 +
                   *(float *)(lVar31 + 0x28) * fVar34 + *(float *)(lVar31 + 0x2c) * fVar40 +
                  *(float *)(lVar31 + 0x40));
        local_188.vertices._12_4_ = 0.0;
        local_1e8._0_16_ = ZEXT816(0x3f800000);
        drawVertex(pbVar21,(btVector3 *)
                           (*(long *)((long)(pAVar16->m_local).m_floats + lVar33 + -8) + 0x10),0.25,
                   (btVector3 *)&local_1e8);
        local_1e8._0_16_ = ZEXT816(0x3f80000000000000);
        drawVertex(pbVar21,(btVector3 *)&local_188,0.25,(btVector3 *)&local_1e8);
        local_1e8.m_capacity = 0x3f800000;
        local_1e8._0_8_ = 0x3f8000003f800000;
        local_1e8._12_4_ = 0;
        (*pbVar21->_vptr_btIDebugDraw[4])
                  (pbVar21,*(long *)((long)(pAVar16->m_local).m_floats + lVar33 + -8) + 0x10,
                   (btVector3 *)&local_188,(btVector3 *)&local_1e8);
        lVar29 = lVar29 + 1;
        lVar33 = lVar33 + 0x68;
      } while (lVar29 < (psb->m_anchors).m_size);
    }
    iVar24 = (psb->m_nodes).m_size;
    uVar28 = local_128._0_4_;
    if (0 < iVar24) {
      lVar33 = 0x60;
      lVar29 = 0;
      do {
        pNVar8 = (psb->m_nodes).m_data;
        if (((*(byte *)(*(long *)((long)(&pNVar8->m_x + -7) + 8 + lVar33) + 0x14) & 1) != 0) &&
           (*(float *)((long)&(((Node *)(&pNVar8->m_x + -1))->super_Feature).super_Element.m_tag +
                      lVar33) <= 0.0)) {
          local_188.vertices._0_16_ = ZEXT816(0x3f800000);
          drawVertex(local_1c0,(btVector3 *)((long)(&pNVar8->m_x + -6) + lVar33),0.25,
                     (btVector3 *)&local_188);
          iVar24 = (psb->m_nodes).m_size;
        }
        lVar29 = lVar29 + 1;
        lVar33 = lVar33 + 0x78;
      } while (lVar29 < iVar24);
    }
  }
  pbVar21 = local_1c0;
  if (((char)uVar28 < '\0') && (0 < (psb->m_notes).m_size)) {
    lVar29 = 0;
    lVar33 = 0;
    do {
      pNVar17 = (psb->m_notes).m_data;
      auVar19 = *(undefined1 (*) [12])pNVar17[lVar33].m_offset.m_floats;
      abVar36 = *&pNVar17[lVar33].m_offset.m_floats;
      local_188.vertices._0_16_ = abVar36;
      if (0 < (long)pNVar17[lVar33].m_rank) {
        fVar40 = auVar19._0_4_;
        fVar35 = auVar19._4_4_;
        local_188.vertices.m_capacity = auVar19._8_4_;
        lVar31 = 0;
        fVar34 = (float)local_188.vertices.m_capacity;
        do {
          local_188.vertices._0_16_ = abVar36;
          auVar20 = (undefined1  [16])local_188.vertices._0_16_;
          lVar12 = *(long *)((long)pNVar17->m_nodes + lVar31 * 8 + lVar29);
          fVar37 = *(float *)((long)pNVar17->m_coords + lVar31 * 4 + lVar29);
          fVar34 = fVar34 + *(float *)(lVar12 + 0x18) * fVar37;
          uVar5 = *(undefined8 *)(lVar12 + 0x10);
          fVar40 = fVar40 + fVar37 * (float)uVar5;
          fVar35 = fVar35 + fVar37 * (float)((ulong)uVar5 >> 0x20);
          local_188.vertices.m_size = (int)fVar35;
          local_188.vertices._0_4_ = fVar40;
          local_188.vertices._12_4_ = auVar20._12_4_;
          local_188.vertices.m_capacity = (int)fVar34;
          lVar31 = lVar31 + 1;
          abVar36 = (btScalar  [4])local_188.vertices._0_16_;
        } while (pNVar17[lVar33].m_rank != lVar31);
      }
      (*pbVar21->_vptr_btIDebugDraw[0xc])(pbVar21,&local_188,pNVar17[lVar33].m_text);
      lVar33 = lVar33 + 1;
      lVar29 = lVar29 + 0x58;
    } while (lVar33 < (psb->m_notes).m_size);
  }
  if ((uVar28 >> 9 & 1) != 0) {
    local_188.vertices._8_8_ = 0x3f800000;
    local_188.vertices._0_8_ = 0x3f800000;
    local_1e8._8_8_ = 0x3f800000;
    local_1e8._0_8_ = 0x3f8000003f800000;
    drawTree(pbVar21,(psb->m_ndbvt).m_root,0,(btVector3 *)&local_188,(btVector3 *)&local_1e8,0,-1);
  }
  if ((uVar28 >> 10 & 1) != 0) {
    local_188.vertices._0_16_ = ZEXT816(0x3f80000000000000);
    local_1e8._0_16_ = ZEXT816(0x3f800000);
    drawTree(pbVar21,(psb->m_fdbvt).m_root,0,(btVector3 *)&local_188,(btVector3 *)&local_1e8,0,-1);
  }
  abVar36._0_12_ = ZEXT812(0x3f800000);
  abVar36[3] = 0.0;
  if ((uVar28 >> 0xb & 1) != 0) {
    local_188.vertices._8_8_ = 0x3f800000;
    local_188.vertices._0_8_ = 0x3f80000000000000;
    local_1e8._0_16_ = abVar36;
    drawTree(pbVar21,(psb->m_cdbvt).m_root,0,(btVector3 *)&local_188,(btVector3 *)&local_1e8,0,-1);
  }
  if (((uVar28 >> 0xc & 1) != 0) && (0 < (psb->m_joints).m_size)) {
    lVar29 = 0;
    do {
      pJVar18 = (psb->m_joints).m_data[lVar29];
      iVar24 = (*pJVar18->_vptr_Joint[5])(pJVar18);
      if (iVar24 == 1) {
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies);
        local_188.vertices._0_16_ = *(undefined1 (*) [16])(pbVar26->m_origin).m_floats;
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies + 1);
        local_1e8._0_16_ = *(undefined1 (*) [16])(pbVar26->m_origin).m_floats;
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies);
        fVar34 = pJVar18->m_refs[0].m_floats[0];
        local_f8 = ZEXT416((uint)fVar34);
        fVar40 = pJVar18->m_refs[0].m_floats[1];
        _local_a8 = ZEXT416((uint)fVar40);
        local_e8 = *(undefined8 *)(pbVar26->m_basis).m_el[0].m_floats;
        uStack_e0 = *(undefined8 *)((pbVar26->m_basis).m_el[0].m_floats + 2);
        local_d8 = *(undefined8 *)((pbVar26->m_basis).m_el[0].m_floats + 1);
        uStack_d0 = *(undefined8 *)((pbVar26->m_basis).m_el[0].m_floats + 3);
        _local_c8 = *(undefined1 (*) [16])((pbVar26->m_basis).m_el[0].m_floats + 2);
        fVar35 = pJVar18->m_refs[0].m_floats[2];
        local_108 = (btScalar  [4])ZEXT416((uint)fVar35);
        local_198 = (btScalar  [4])
                    ZEXT416((uint)((pbVar26->m_basis).m_el[2].m_floats[2] * fVar35 +
                                  (pbVar26->m_basis).m_el[2].m_floats[0] * fVar34 +
                                  (pbVar26->m_basis).m_el[2].m_floats[1] * fVar40));
        local_68 = ZEXT416((uint)(pbVar26->m_basis).m_el[1].m_floats[1]);
        local_58 = ZEXT416((uint)(pbVar26->m_basis).m_el[1].m_floats[0]);
        local_98 = ZEXT416((uint)(pbVar26->m_basis).m_el[1].m_floats[2]);
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies + 1);
        fVar34 = pJVar18->m_refs[1].m_floats[0];
        local_b8 = ZEXT416((uint)fVar34);
        fVar40 = pJVar18->m_refs[1].m_floats[1];
        local_128 = ZEXT416((uint)fVar40);
        fVar35 = pJVar18->m_refs[1].m_floats[2];
        _local_1b8 = ZEXT416((uint)fVar35);
        local_118 = ZEXT416((uint)((pbVar26->m_basis).m_el[2].m_floats[2] * fVar35 +
                                  (pbVar26->m_basis).m_el[2].m_floats[0] * fVar34 +
                                  (pbVar26->m_basis).m_el[2].m_floats[1] * fVar40));
        fVar39 = (float)local_d8 * (float)local_a8._0_4_;
        fVar41 = (float)local_68._0_4_ * (float)local_a8._0_4_;
        fVar38 = (float)uStack_d0 * (float)local_a8._0_4_;
        fVar42 = uStack_d0._4_4_ * (float)local_a8._0_4_;
        local_d8 = *(undefined8 *)(pbVar26->m_basis).m_el[0].m_floats;
        uStack_d0 = *(undefined8 *)((pbVar26->m_basis).m_el[0].m_floats + 2);
        _local_a8 = *(undefined1 (*) [16])((pbVar26->m_basis).m_el[0].m_floats + 1);
        fVar34 = (float)local_f8._0_4_ * (float)local_e8;
        fVar40 = (float)local_f8._0_4_ * (float)local_58._0_4_;
        fVar35 = (float)local_f8._0_4_ * (float)uStack_e0;
        fVar37 = (float)local_f8._0_4_ * uStack_e0._4_4_;
        local_e8 = *(undefined8 *)((pbVar26->m_basis).m_el[0].m_floats + 2);
        uStack_e0 = *(undefined8 *)(pbVar26->m_basis).m_el[1].m_floats;
        local_f8 = ZEXT416((uint)(pbVar26->m_basis).m_el[1].m_floats[1]);
        local_198[0] = local_198[0] * 10.0;
        fVar43 = local_108[0] * (float)local_c8._8_4_;
        fStack_bc = local_108[0] * fStack_bc;
        fVar34 = (local_108[0] * (float)local_c8._0_4_ + fVar34 + fVar39) * 10.0;
        local_108[1] = (local_108[0] * (float)local_98._0_4_ + fVar40 + fVar41) * 10.0;
        local_108[0] = fVar34;
        local_108[2] = (fVar43 + fVar35 + fVar38) * 0.0;
        local_108[3] = (fStack_bc + fVar37 + fVar42) * 0.0;
        local_98 = ZEXT416((uint)(pbVar26->m_basis).m_el[1].m_floats[2]);
        local_1f8.m_floats[1] = local_188.vertices.m_size + local_108[1];
        local_1f8.m_floats[0] = local_188.vertices._0_4_ + fVar34;
        local_1f8.m_floats[2] = (float)local_188.vertices.m_capacity + local_198[0];
        local_1f8.m_floats[3] = 0.0;
        local_1a8 = ZEXT816(0x3f8000003f800000);
        _local_c8 = ZEXT416((uint)(pbVar26->m_basis).m_el[1].m_floats[0]);
        (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,&local_188,&local_1f8,local_1a8);
        local_118._0_4_ = (float)local_118._0_4_ * 10.0;
        fVar40 = (float)local_1b8._0_4_ * (float)uStack_e0;
        fVar35 = (float)local_1b8._0_4_ * uStack_e0._4_4_;
        fVar34 = ((float)local_1b8._0_4_ * (float)local_e8 +
                 (float)local_b8._0_4_ * (float)local_d8 +
                 (float)local_a8._0_4_ * (float)local_128._0_4_) * 10.0;
        local_1b8._4_4_ =
             ((float)local_1b8._0_4_ * (float)local_98._0_4_ +
             (float)local_b8._0_4_ * (float)local_c8._0_4_ +
             (float)local_f8._0_4_ * (float)local_128._0_4_) * 10.0;
        local_1b8._0_4_ = fVar34;
        uStack_1b0._0_4_ =
             (fVar40 + (float)local_b8._0_4_ * (float)uStack_d0 +
                       (float)local_a8._8_4_ * (float)local_128._0_4_) * 0.0;
        uStack_1b0._4_4_ =
             (fVar35 + (float)local_b8._0_4_ * uStack_d0._4_4_ + fStack_9c * (float)local_128._0_4_)
             * 0.0;
        local_1f8.m_floats[1] = local_188.vertices.m_size + (float)local_1b8._4_4_;
        local_1f8.m_floats[0] = local_188.vertices._0_4_ + fVar34;
        local_1f8.m_floats[2] = (float)local_188.vertices.m_capacity + (float)local_118._0_4_;
        local_1f8.m_floats[3] = 0.0;
        local_1a8 = ZEXT816(0x3f8000003f800000);
        (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,&local_188,&local_1f8,local_1a8);
        local_1f8.m_floats[1] = local_1e8.m_size + local_108[1];
        local_1f8.m_floats[0] = local_1e8._0_4_ + local_108[0];
        local_1f8.m_floats[2] = local_198[0] + (float)local_1e8.m_capacity;
        local_1f8.m_floats[3] = 0.0;
        local_1a8._8_4_ = 0x3f800000;
        local_1a8._0_8_ = 0x3f80000000000000;
        local_1a8._12_4_ = 0;
        (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,&local_1e8,&local_1f8,local_1a8);
        local_1f8.m_floats[1] = local_1e8.m_size + (float)local_1b8._4_4_;
        local_1f8.m_floats[0] = local_1e8._0_4_ + (float)local_1b8._0_4_;
        local_1f8.m_floats[2] = local_118._0_4_ + (float)local_1e8.m_capacity;
        local_1f8.m_floats[3] = 0.0;
        local_1a8._8_4_ = 0x3f800000;
        local_1a8._0_8_ = 0x3f80000000000000;
        local_1a8._12_4_ = 0;
        (*pbVar21->_vptr_btIDebugDraw[4])(pbVar21,&local_1e8,&local_1f8,local_1a8);
      }
      else if (iVar24 == 0) {
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies);
        fVar34 = pJVar18->m_refs[0].m_floats[0];
        fVar40 = pJVar18->m_refs[0].m_floats[1];
        fVar35 = pJVar18->m_refs[0].m_floats[2];
        uVar5 = *(undefined8 *)(pbVar26->m_origin).m_floats;
        local_188.vertices._0_4_ =
             (float)uVar5 +
             (pbVar26->m_basis).m_el[0].m_floats[2] * fVar35 +
             (pbVar26->m_basis).m_el[0].m_floats[0] * fVar34 +
             (pbVar26->m_basis).m_el[0].m_floats[1] * fVar40;
        local_188.vertices.m_size =
             (int)((float)((ulong)uVar5 >> 0x20) +
                  (pbVar26->m_basis).m_el[1].m_floats[2] * fVar35 +
                  (pbVar26->m_basis).m_el[1].m_floats[0] * fVar34 +
                  (pbVar26->m_basis).m_el[1].m_floats[1] * fVar40);
        local_188.vertices.m_capacity =
             (int)((pbVar26->m_basis).m_el[2].m_floats[2] * fVar35 +
                   (pbVar26->m_basis).m_el[2].m_floats[0] * fVar34 +
                   (pbVar26->m_basis).m_el[2].m_floats[1] * fVar40 + (pbVar26->m_origin).m_floats[2]
                  );
        local_188.vertices._12_4_ = 0.0;
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies + 1);
        fVar34 = pJVar18->m_refs[1].m_floats[0];
        fVar40 = pJVar18->m_refs[1].m_floats[1];
        fVar35 = pJVar18->m_refs[1].m_floats[2];
        uVar5 = *(undefined8 *)(pbVar26->m_origin).m_floats;
        local_1e8._0_4_ =
             (float)uVar5 +
             (pbVar26->m_basis).m_el[0].m_floats[2] * fVar35 +
             (pbVar26->m_basis).m_el[0].m_floats[0] * fVar34 +
             (pbVar26->m_basis).m_el[0].m_floats[1] * fVar40;
        local_1e8.m_size =
             (int)((float)((ulong)uVar5 >> 0x20) +
                  (pbVar26->m_basis).m_el[1].m_floats[2] * fVar35 +
                  (pbVar26->m_basis).m_el[1].m_floats[0] * fVar34 +
                  (pbVar26->m_basis).m_el[1].m_floats[1] * fVar40);
        local_1e8.m_capacity =
             (int)((pbVar26->m_basis).m_el[2].m_floats[2] * fVar35 +
                   (pbVar26->m_basis).m_el[2].m_floats[0] * fVar34 +
                   (pbVar26->m_basis).m_el[2].m_floats[1] * fVar40 + (pbVar26->m_origin).m_floats[2]
                  );
        local_1e8._12_4_ = 0.0;
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies);
        local_1f8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        (*pbVar21->_vptr_btIDebugDraw[4])
                  (pbVar21,&pbVar26->m_origin,(btVector3 *)&local_188,&local_1f8);
        pbVar26 = btSoftBody::Body::xform(pJVar18->m_bodies + 1);
        local_1f8.m_floats[2] = 1.0;
        local_1f8.m_floats[0] = 0.0;
        local_1f8.m_floats[1] = 1.0;
        local_1f8.m_floats[3] = 0.0;
        (*pbVar21->_vptr_btIDebugDraw[4])
                  (pbVar21,&pbVar26->m_origin,(btVector3 *)&local_1e8,&local_1f8);
        local_1f8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        drawVertex(pbVar21,(btVector3 *)&local_188,0.25,&local_1f8);
        local_1f8.m_floats[2] = 1.0;
        local_1f8.m_floats[3] = 0.0;
        local_1f8.m_floats[0] = 0.0;
        local_1f8.m_floats[1] = 1.0;
        drawVertex(pbVar21,(btVector3 *)&local_1e8,0.25,&local_1f8);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < (psb->m_joints).m_size);
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::Draw(	btSoftBody* psb,
										btIDebugDraw* idraw,
										int drawflags)
{
	const btScalar		scl=(btScalar)0.1;
	const btScalar		nscl=scl*5;
	const btVector3		lcolor=btVector3(0,0,0);
	const btVector3		ncolor=btVector3(1,1,1);
	const btVector3		ccolor=btVector3(1,0,0);
	int i,j,nj;

		/* Clusters	*/ 
	if(0!=(drawflags&fDrawFlags::Clusters))
	{
		srand(1806);
		for(i=0;i<psb->m_clusters.size();++i)
		{
			if(psb->m_clusters[i]->m_collide)
			{
				btVector3						color(	rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX);
				color=color.normalized()*0.75;
				btAlignedObjectArray<btVector3>	vertices;
				vertices.resize(psb->m_clusters[i]->m_nodes.size());
				for(j=0,nj=vertices.size();j<nj;++j)
				{				
					vertices[j]=psb->m_clusters[i]->m_nodes[j]->m_x;
				}
#define USE_NEW_CONVEX_HULL_COMPUTER
#ifdef USE_NEW_CONVEX_HULL_COMPUTER
				btConvexHullComputer	computer;
				int stride = sizeof(btVector3);
				int count = vertices.size();
				btScalar shrink=0.f;
				btScalar shrinkClamp=0.f;
				computer.compute(&vertices[0].getX(),stride,count,shrink,shrinkClamp);
				for (int i=0;i<computer.faces.size();i++)
				{

					int face = computer.faces[i];
					//printf("face=%d\n",face);
					const btConvexHullComputer::Edge*  firstEdge = &computer.edges[face];
					const btConvexHullComputer::Edge*  edge = firstEdge->getNextEdgeOfFace();

					int v0 = firstEdge->getSourceVertex();
					int v1 = firstEdge->getTargetVertex();
					while (edge!=firstEdge)
					{
						int v2 = edge->getTargetVertex();
						idraw->drawTriangle(computer.vertices[v0],computer.vertices[v1],computer.vertices[v2],color,1);
						edge = edge->getNextEdgeOfFace();
						v0=v1;
						v1=v2;
					};
				}
#else

				HullDesc		hdsc(QF_TRIANGLES,vertices.size(),&vertices[0]);
				HullResult		hres;
				HullLibrary		hlib;
				hdsc.mMaxVertices=vertices.size();
				hlib.CreateConvexHull(hdsc,hres);
				const btVector3	center=average(hres.m_OutputVertices);
				add(hres.m_OutputVertices,-center);
				mul(hres.m_OutputVertices,(btScalar)1);
				add(hres.m_OutputVertices,center);
				for(j=0;j<(int)hres.mNumFaces;++j)
				{
					const int idx[]={hres.m_Indices[j*3+0],hres.m_Indices[j*3+1],hres.m_Indices[j*3+2]};
					idraw->drawTriangle(hres.m_OutputVertices[idx[0]],
						hres.m_OutputVertices[idx[1]],
						hres.m_OutputVertices[idx[2]],
						color,1);
				}
				hlib.ReleaseResult(hres);
#endif

			}
			/* Velocities	*/ 
#if 0
			for(int j=0;j<psb->m_clusters[i].m_nodes.size();++j)
			{
				const btSoftBody::Cluster&	c=psb->m_clusters[i];
				const btVector3				r=c.m_nodes[j]->m_x-c.m_com;
				const btVector3				v=c.m_lv+btCross(c.m_av,r);
				idraw->drawLine(c.m_nodes[j]->m_x,c.m_nodes[j]->m_x+v,btVector3(1,0,0));
			}
#endif
			/* Frame		*/ 
	//		btSoftBody::Cluster& c=*psb->m_clusters[i];
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(10,0,0),btVector3(1,0,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,10,0),btVector3(0,1,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,0,10),btVector3(0,0,1));
		}
	}
	else
	{
		/* Nodes	*/ 
		if(0!=(drawflags&fDrawFlags::Nodes))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(n.m_x-btVector3(scl,0,0),n.m_x+btVector3(scl,0,0),btVector3(1,0,0));
				idraw->drawLine(n.m_x-btVector3(0,scl,0),n.m_x+btVector3(0,scl,0),btVector3(0,1,0));
				idraw->drawLine(n.m_x-btVector3(0,0,scl),n.m_x+btVector3(0,0,scl),btVector3(0,0,1));
			}
		}
		/* Links	*/ 
		if(0!=(drawflags&fDrawFlags::Links))
		{
			for(i=0;i<psb->m_links.size();++i)
			{
				const btSoftBody::Link&	l=psb->m_links[i];
				if(0==(l.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(l.m_n[0]->m_x,l.m_n[1]->m_x,lcolor);
			}
		}
		/* Normals	*/ 
		if(0!=(drawflags&fDrawFlags::Normals))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				const btVector3			d=n.m_n*nscl;
				idraw->drawLine(n.m_x,n.m_x+d,ncolor);
				idraw->drawLine(n.m_x,n.m_x-d,ncolor*0.5);
			}
		}
		/* Contacts	*/ 
		if(0!=(drawflags&fDrawFlags::Contacts))
		{
			static const btVector3		axis[]={btVector3(1,0,0),
				btVector3(0,1,0),
				btVector3(0,0,1)};
			for(i=0;i<psb->m_rcontacts.size();++i)
			{		
				const btSoftBody::RContact&	c=psb->m_rcontacts[i];
				const btVector3				o=	c.m_node->m_x-c.m_cti.m_normal*
					(btDot(c.m_node->m_x,c.m_cti.m_normal)+c.m_cti.m_offset);
				const btVector3				x=btCross(c.m_cti.m_normal,axis[c.m_cti.m_normal.minAxis()]).normalized();
				const btVector3				y=btCross(x,c.m_cti.m_normal).normalized();
				idraw->drawLine(o-x*nscl,o+x*nscl,ccolor);
				idraw->drawLine(o-y*nscl,o+y*nscl,ccolor);
				idraw->drawLine(o,o+c.m_cti.m_normal*nscl*3,btVector3(1,1,0));
			}
		}
		/* Faces	*/ 
	if(0!=(drawflags&fDrawFlags::Faces))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col(0,(btScalar)0.7,0);
		for(i=0;i<psb->m_faces.size();++i)
		{
			const btSoftBody::Face&	f=psb->m_faces[i];
			if(0==(f.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3			x[]={f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x};
			const btVector3			c=(x[0]+x[1]+x[2])/3;
			idraw->drawTriangle((x[0]-c)*scl+c,
				(x[1]-c)*scl+c,
				(x[2]-c)*scl+c,
				col,alp);
		}	
	}
	/* Tetras	*/ 
	if(0!=(drawflags&fDrawFlags::Tetras))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col((btScalar)0.3,(btScalar)0.3,(btScalar)0.7);
		for(int i=0;i<psb->m_tetras.size();++i)
		{
			const btSoftBody::Tetra&	t=psb->m_tetras[i];
			if(0==(t.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3				x[]={t.m_n[0]->m_x,t.m_n[1]->m_x,t.m_n[2]->m_x,t.m_n[3]->m_x};
			const btVector3				c=(x[0]+x[1]+x[2]+x[3])/4;
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[2]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[1]-c)*scl+c,(x[2]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[2]-c)*scl+c,(x[0]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
		}	
	}
	}
	/* Anchors	*/ 
	if(0!=(drawflags&fDrawFlags::Anchors))
	{
		for(i=0;i<psb->m_anchors.size();++i)
		{
			const btSoftBody::Anchor&	a=psb->m_anchors[i];
			const btVector3				q=a.m_body->getWorldTransform()*a.m_local;
			drawVertex(idraw,a.m_node->m_x,0.25,btVector3(1,0,0));
			drawVertex(idraw,q,0.25,btVector3(0,1,0));
			idraw->drawLine(a.m_node->m_x,q,btVector3(1,1,1));
		}
		for(i=0;i<psb->m_nodes.size();++i)
		{
			const btSoftBody::Node&	n=psb->m_nodes[i];		
			if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			if(n.m_im<=0)
			{
				drawVertex(idraw,n.m_x,0.25,btVector3(1,0,0));
			}
		}
	}
	

	/* Notes	*/ 
	if(0!=(drawflags&fDrawFlags::Notes))
	{
		for(i=0;i<psb->m_notes.size();++i)
		{
			const btSoftBody::Note&	n=psb->m_notes[i];
			btVector3				p=n.m_offset;
			for(int j=0;j<n.m_rank;++j)
			{
				p+=n.m_nodes[j]->m_x*n.m_coords[j];
			}
			idraw->draw3dText(p,n.m_text);
		}
	}
	/* Node tree	*/ 
	if(0!=(drawflags&fDrawFlags::NodeTree))		DrawNodeTree(psb,idraw);
	/* Face tree	*/ 
	if(0!=(drawflags&fDrawFlags::FaceTree))		DrawFaceTree(psb,idraw);
	/* Cluster tree	*/ 
	if(0!=(drawflags&fDrawFlags::ClusterTree))	DrawClusterTree(psb,idraw);
	/* Joints		*/ 
	if(0!=(drawflags&fDrawFlags::Joints))
	{
		for(i=0;i<psb->m_joints.size();++i)
		{
			const btSoftBody::Joint*	pj=psb->m_joints[i];
			switch(pj->Type())
			{
			case	btSoftBody::Joint::eType::Linear:
				{
					const btSoftBody::LJoint*	pjl=(const btSoftBody::LJoint*)pj;
					const btVector3	a0=pj->m_bodies[0].xform()*pjl->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform()*pjl->m_refs[1];
					idraw->drawLine(pj->m_bodies[0].xform().getOrigin(),a0,btVector3(1,1,0));
					idraw->drawLine(pj->m_bodies[1].xform().getOrigin(),a1,btVector3(0,1,1));
					drawVertex(idraw,a0,0.25,btVector3(1,1,0));
					drawVertex(idraw,a1,0.25,btVector3(0,1,1));
				}
				break;
			case	btSoftBody::Joint::eType::Angular:
				{
					//const btSoftBody::AJoint*	pja=(const btSoftBody::AJoint*)pj;
					const btVector3	o0=pj->m_bodies[0].xform().getOrigin();
					const btVector3	o1=pj->m_bodies[1].xform().getOrigin();
					const btVector3	a0=pj->m_bodies[0].xform().getBasis()*pj->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform().getBasis()*pj->m_refs[1];
					idraw->drawLine(o0,o0+a0*10,btVector3(1,1,0));
					idraw->drawLine(o0,o0+a1*10,btVector3(1,1,0));
					idraw->drawLine(o1,o1+a0*10,btVector3(0,1,1));
					idraw->drawLine(o1,o1+a1*10,btVector3(0,1,1));
					break;
				}
				default:
				{
				}
					
			}		
		}
	}
}